

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O0

void __thiscall
TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test::testBody
          (TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test *this)

{
  string sep;
  ApprovalTestNamer namer;
  SubdirectoryDisposer suppress_subdirectory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  SubdirectoryDisposer *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  ApprovalTestNamer *in_stack_ffffffffffffff18;
  string local_c8 [32];
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string local_88 [63];
  undefined1 local_49 [73];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::useApprovalsSubdirectory(in_stack_ffffffffffffff08);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  ApprovalTests::ApprovalTestNamer::ApprovalTestNamer((ApprovalTestNamer *)__rhs);
  ApprovalTests::SystemUtils::getDirectorySeparator_abi_cxx11_();
  ApprovalTests::ApprovalTestNamer::getDirectory_abi_cxx11_(in_stack_ffffffffffffff18);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+(in_stack_fffffffffffffed8,__rhs);
  std::operator+(in_stack_fffffffffffffed8,(char *)__rhs);
  std::operator+(in_stack_fffffffffffffed8,__rhs);
  anon_unknown.dwarf_12c7c::checkEndsWithIgnoringCase
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(local_88);
  ApprovalTests::ApprovalTestNamer::~ApprovalTestNamer((ApprovalTestNamer *)0x117828);
  ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(in_stack_fffffffffffffee0);
  return;
}

Assistant:

TEST(NamerTestGroup, ItCanGiveYouTheTestDirectory)
{
    // This should work with CaseSensitive::Yes.
    // However, it would fail when run in Visual Studio 2017 as lower-case source-file names are returned.
    // We've fixed this for filenames, but not directory names, so this test ignores case.
    // See https://stackoverflow.com/questions/49068785/how-to-find-the-filename-from-a-c11-stat-objects-file-serial-number-on-window
    auto suppress_subdirectory = Approvals::useApprovalsSubdirectory("");
    ApprovalTestNamer namer;
    auto sep = SystemUtils::getDirectorySeparator();
    checkEndsWithIgnoringCase(namer.getDirectory(),
                              sep + "CppUTest_Tests" + sep + "namers" + sep);
}